

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::SignCase::compare(SignCase *this,void **inputs,void **outputs)

{
  float fVar1;
  DataType dataType;
  Precision PVar2;
  int iVar3;
  pointer pSVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  ostringstream *poVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  deUint32 u32;
  HexFloat local_3c;
  undefined1 local_38 [16];
  
  pSVar4 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar4->varType).m_data.basic.type;
  PVar2 = (pSVar4->varType).m_data.basic.precision;
  iVar6 = glu::getDataTypeScalarSize(dataType);
  if (dataType - TYPE_FLOAT < 4) {
    uVar9 = 0xffff;
    if (PVar2 != PRECISION_LOWP) {
      uVar9 = 0;
    }
    if (0 < iVar6) {
      lVar10 = 0;
      do {
        fVar1 = *(float *)((long)*inputs + lVar10 * 4);
        uVar12 = -(uint)(fVar1 < 0.0);
        uVar5 = uVar12 & 0xbf800000 | ~uVar12 & -(uint)(0.0 < fVar1) & 0x3f800000;
        local_38 = ZEXT416(uVar5);
        uVar12 = *(uint *)((long)*outputs + lVar10 * 4);
        uVar11 = uVar5 - uVar12;
        if (uVar5 < uVar12) {
          uVar11 = -(uVar5 - uVar12);
        }
        if (uVar9 < uVar11) {
          poVar8 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar7 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
          local_3c.value = (float)local_38._0_4_;
          poVar7 = Functional::operator<<(poVar7,&local_3c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," with ULP threshold ",0x14);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          return false;
        }
        lVar10 = lVar10 + 1;
      } while (iVar6 != (int)lVar10);
    }
  }
  else if (0 < iVar6) {
    lVar10 = 0;
    do {
      iVar3 = *(int *)((long)*inputs + lVar10 * 4);
      uVar9 = (uint)(iVar3 != 0);
      if (iVar3 < 0) {
        uVar9 = 0xffffffff;
      }
      if (*(uint *)((long)*outputs + lVar10 * 4) != uVar9) {
        poVar8 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar7 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
        std::ostream::operator<<(poVar7,uVar9);
        return false;
      }
      lVar10 = lVar10 + 1;
    } while (iVar6 != (int)lVar10);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (glu::isDataTypeFloatOrVec(type))
		{
			// Both highp and mediump should be able to represent -1, 0, and +1 exactly
			const deUint32 maxUlpDiff = precision == glu::PRECISION_LOWP ? getMaxUlpDiffFromBits(getMinMantissaBits(precision)) : 0;

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref0		= in0 < 0.0f ? -1.0f :
											  in0 > 0.0f ? +1.0f : 0.0f;
				const deUint32	ulpDiff0	= getUlpDiff(out0, ref0);

				if (ulpDiff0 > maxUlpDiff)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " with ULP threshold " << maxUlpDiff << ", got ULP diff " << ulpDiff0;
					return false;
				}
			}
		}
		else
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int	in0		= ((const int*)inputs[0])[compNdx];
				const int	out0	= ((const int*)outputs[0])[compNdx];
				const int	ref0	= in0 < 0 ? -1 :
									  in0 > 0 ? +1 : 0;

				if (out0 != ref0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << ref0;
					return false;
				}
			}
		}

		return true;
	}